

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::
StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
          *this,time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *time_point)

{
  undefined8 local_38;
  string local_30;
  
  local_38 = *(undefined8 *)this;
  StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>::convert_abi_cxx11_
            (&local_30,
             (StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void> *)&local_38,
             &time_point->__d);
  std::operator+(__return_storage_ptr__,&local_30," since epoch");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::time_point<Clock, Duration> const& time_point) {
            return ::Catch::Detail::stringify(time_point.time_since_epoch()) + " since epoch";
        }